

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

CompileInfo * __thiscall cmTarget::GetCompileInfo(cmTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  cmMakefile *this_00;
  ulong uVar5;
  cmTargetInternals *pcVar6;
  pointer ppVar7;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_CompileInfo>_&>::value,_pair<iterator,_bool>_>
  _Var8;
  iterator local_158;
  undefined1 local_150;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
  local_148;
  undefined1 local_140 [8];
  value_type entry;
  string local_f8;
  undefined1 local_d8 [8];
  CompileInfo info;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
  local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
  local_a0;
  const_iterator i;
  undefined1 local_78 [8];
  string config_upper;
  allocator local_41;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)0x0;
  }
  else {
    TVar2 = GetType(this);
    if ((int)TVar2 < 5) {
      std::__cxx11::string::string((string *)local_78);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmsys::SystemTools::UpperCase((string *)&i,(string *)msg.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_78,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
      }
      pcVar6 = cmTargetInternalPointer::operator->(&this->Internal);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>_>
           ::find(&pcVar6->CompileInfoMap,(key_type *)local_78);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
      ::_Rb_tree_const_iterator(&local_a0,&local_a8);
      pcVar6 = cmTargetInternalPointer::operator->(&this->Internal);
      info.CompilePdbDir.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>_>
           ::end(&pcVar6->CompileInfoMap);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
      ::_Rb_tree_const_iterator(&local_b0,(iterator *)((long)&info.CompilePdbDir.field_2 + 8));
      bVar1 = std::operator==(&local_a0,&local_b0);
      if (bVar1) {
        CompileInfo::CompileInfo((CompileInfo *)local_d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f8,"COMPILE_PDB",
                   (allocator *)(entry.second.CompilePdbDir.field_2._M_local_buf + 0xf));
        ComputePDBOutputDir(this,&local_f8,(string *)msg.field_2._8_8_,(string *)local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(entry.second.CompilePdbDir.field_2._M_local_buf + 0xf));
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::CompileInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                    *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (CompileInfo *)local_d8);
        pcVar6 = cmTargetInternalPointer::operator->(&this->Internal);
        _Var8 = std::
                map<std::__cxx11::string,cmTarget::CompileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>>
                ::insert<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>&>
                          ((map<std::__cxx11::string,cmTarget::CompileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>>
                            *)&pcVar6->CompileInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                            *)local_140);
        local_158._M_node = (_Base_ptr)_Var8.first._M_node;
        local_150 = _Var8.second;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
        ::_Rb_tree_const_iterator(&local_148,&local_158);
        local_a0._M_node = local_148._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                 *)local_140);
        CompileInfo::~CompileInfo((CompileInfo *)local_d8);
      }
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>
               ::operator->(&local_a0);
      this_local = (cmTarget *)&ppVar7->second;
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_40,"cmTarget::GetCompileInfo called for ",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      psVar3 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator+=((string *)local_40,(string *)psVar3);
      std::__cxx11::string::operator+=((string *)local_40," which has type ");
      TVar2 = GetType(this);
      pcVar4 = GetTargetTypeName(TVar2);
      std::__cxx11::string::operator+=((string *)local_40,pcVar4);
      this_00 = GetMakefile(this);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,(string *)local_40);
      this_local = (cmTarget *)0x0;
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return (CompileInfo *)this_local;
}

Assistant:

cmTarget::CompileInfo const* cmTarget::GetCompileInfo(
                                            const std::string& config) const
{
  // There is no compile information for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  if(this->GetType() > cmTarget::OBJECT_LIBRARY)
    {
    std::string msg = "cmTarget::GetCompileInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmTarget::GetTargetTypeName(this->GetType());
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return 0;
    }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  typedef cmTargetInternals::CompileInfoMapType CompileInfoMapType;
  CompileInfoMapType::const_iterator i =
    this->Internal->CompileInfoMap.find(config_upper);
  if(i == this->Internal->CompileInfoMap.end())
    {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->CompileInfoMap.insert(entry).first;
    }
  return &i->second;
}